

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O2

Test * anon_unknown.dwarf_78567::DiskInterfaceTestStatBadPath::Create(void)

{
  DiskInterfaceTest *this;
  
  this = (DiskInterfaceTest *)operator_new(0x58);
  DiskInterfaceTest::DiskInterfaceTest(this);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__DiskInterfaceTest_001e2068;
  g_current_test = (Test *)this;
  return &this->super_Test;
}

Assistant:

TEST_F(DiskInterfaceTest, StatBadPath) {
  string err;
#ifdef _WIN32
  string bad_path("cc:\\foo");
  EXPECT_EQ(-1, disk_.Stat(bad_path, &err));
  EXPECT_NE("", err);
#else
  string too_long_name(512, 'x');
  EXPECT_EQ(-1, disk_.Stat(too_long_name, &err));
  EXPECT_NE("", err);
#endif
}